

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O3

void Hop_ManCreateRefs(Hop_Man_t *p)

{
  undefined1 *puVar1;
  uint *puVar2;
  int *piVar3;
  Hop_Obj_t *pHVar4;
  int iVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  
  if (p->fRefCount == 0) {
    p->fRefCount = 1;
    puVar1 = &p->pConst1->field_0x20;
    *(uint *)puVar1 = *(uint *)puVar1 & 0x3f;
    pVVar7 = p->vPis;
    if (0 < pVVar7->nSize) {
      lVar6 = 0;
      do {
        puVar2 = (uint *)((long)pVVar7->pArray[lVar6] + 0x20);
        *puVar2 = *puVar2 & 0x3f;
        lVar6 = lVar6 + 1;
        pVVar7 = p->vPis;
      } while (lVar6 < pVVar7->nSize);
    }
    iVar5 = p->nTableSize;
    if (0 < iVar5) {
      lVar6 = 0;
      do {
        if (p->pTable[lVar6] != (Hop_Obj_t *)0x0) {
          puVar1 = &p->pTable[lVar6]->field_0x20;
          *(uint *)puVar1 = *(uint *)puVar1 & 0x3f;
          iVar5 = p->nTableSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar5);
    }
    pVVar7 = p->vPos;
    if (0 < pVVar7->nSize) {
      lVar6 = 0;
      do {
        puVar2 = (uint *)((long)pVVar7->pArray[lVar6] + 0x20);
        *puVar2 = *puVar2 & 0x3f;
        lVar6 = lVar6 + 1;
        pVVar7 = p->vPos;
      } while (lVar6 < pVVar7->nSize);
      iVar5 = p->nTableSize;
    }
    if (0 < iVar5) {
      lVar6 = 0;
      do {
        pHVar4 = p->pTable[lVar6];
        if (pHVar4 != (Hop_Obj_t *)0x0) {
          piVar3 = (int *)(((ulong)pHVar4->pFanin0 & 0xfffffffffffffffe) + 0x20);
          *piVar3 = *piVar3 + 0x40;
          piVar3 = (int *)(((ulong)pHVar4->pFanin1 & 0xfffffffffffffffe) + 0x20);
          *piVar3 = *piVar3 + 0x40;
          iVar5 = p->nTableSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar5);
      pVVar7 = p->vPos;
    }
    if (0 < pVVar7->nSize) {
      lVar6 = 0;
      do {
        piVar3 = (int *)((*(ulong *)((long)pVVar7->pArray[lVar6] + 0x10) & 0xfffffffffffffffe) +
                        0x20);
        *piVar3 = *piVar3 + 0x40;
        lVar6 = lVar6 + 1;
        pVVar7 = p->vPos;
      } while (lVar6 < pVVar7->nSize);
    }
  }
  return;
}

Assistant:

void Hop_ManCreateRefs( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    if ( p->fRefCount )
        return;
    p->fRefCount = 1;
    // clear refs
    Hop_ObjClearRef( Hop_ManConst1(p) );
    Hop_ManForEachPi( p, pObj, i )
        Hop_ObjClearRef( pObj );
    Hop_ManForEachNode( p, pObj, i )
        Hop_ObjClearRef( pObj );
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjClearRef( pObj );
    // set refs
    Hop_ManForEachNode( p, pObj, i )
    {
        Hop_ObjRef( Hop_ObjFanin0(pObj) );
        Hop_ObjRef( Hop_ObjFanin1(pObj) );
    }
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjRef( Hop_ObjFanin0(pObj) );
}